

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

bool Corrade::Utility::Path::exists(StringView filename)

{
  int iVar1;
  char *__name;
  size_t in_RCX;
  StringView view;
  String local_20;
  
  view._sizePlusFlags = in_RCX;
  view._data = (char *)filename._sizePlusFlags;
  Containers::String::nullTerminatedView(&local_20,(String *)filename._data,view);
  __name = Containers::String::data(&local_20);
  iVar1 = access(__name,0);
  Containers::String::~String(&local_20);
  return iVar1 == 0;
}

Assistant:

bool exists(const Containers::StringView filename) {
    /* Sane platforms */
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    return access(Containers::String::nullTerminatedView(filename).data(), F_OK) == 0;

    /* Windows (not Store/Phone) */
    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
    return GetFileAttributesW(Unicode::widen(filename)) != INVALID_FILE_ATTRIBUTES;

    /* Windows Store/Phone not implemented */
    #else
    static_cast<void>(filename);
    Error{} << "Utility::Path::exists(): not implemented on this platform";
    return false;
    #endif
}